

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.hpp
# Opt level: O0

void __thiscall Transformed::Transformed(Transformed *this,Primitive *inner,mat4f *m)

{
  mat4f a;
  float fVar1;
  uint uVar2;
  void *in_RDX;
  long *in_RSI;
  mat4f *in_RDI;
  vec3f p;
  int i;
  point boundpoints [8];
  AABox t;
  undefined8 in_stack_fffffffffffffe88;
  undefined8 in_stack_fffffffffffffe90;
  vec3f *v;
  undefined8 in_stack_fffffffffffffea8;
  undefined8 local_13c;
  undefined8 local_134;
  undefined8 local_12c;
  int local_124;
  AABox local_f0;
  vec3f local_d8;
  vec3f local_cc;
  vec3f local_c0;
  vec3f local_b4;
  vec3f local_a8;
  vec3f local_9c;
  vec3f local_90;
  vec3f local_84;
  AABox local_70;
  undefined1 local_58 [16];
  point *local_48;
  AABox *pAStack_40;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  void *local_18;
  long *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  Primitive::Primitive((Primitive *)in_RDI);
  *(undefined ***)in_RDI->data[0] = &PTR_intersect_001e7748;
  *(long **)((long)in_RDI->data[0] + 8) = local_10;
  memcpy(in_RDI->data + 1,local_18,0x40);
  v = (vec3f *)(in_RDI[1].data + 1);
  memcpy(local_58,local_18,0x40);
  a.data[0][2] = (float)(undefined4)local_28;
  a.data[0][3] = (float)local_28._4_4_;
  a.data[0][0] = (float)(undefined4)uStack_30;
  a.data[0][1] = (float)uStack_30._4_4_;
  a.data[1][0] = (float)(undefined4)uStack_20;
  a.data[1][1] = (float)uStack_20._4_4_;
  a.data[1][2] = (float)(int)in_stack_fffffffffffffe88;
  a.data[1][3] = (float)(int)((ulong)in_stack_fffffffffffffe88 >> 0x20);
  a.data[2][0] = (float)(int)in_stack_fffffffffffffe90;
  a.data[2][1] = (float)(int)((ulong)in_stack_fffffffffffffe90 >> 0x20);
  a.data[2]._8_8_ = v;
  a.data[3]._0_8_ = in_RDI;
  a.data[3][2] = (float)(int)in_stack_fffffffffffffea8;
  a.data[3][3] = (float)(int)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  inverse(a);
  AABox::AABox((AABox *)(in_RDI[2].data + 1));
  (**(code **)(*local_10 + 8))(&local_70);
  uVar2 = AABox::finite(&local_70,8.01365297814802e-315);
  if ((uVar2 & 1) == 0) {
    fVar1 = AABox::infAAB.x2;
    *(float *)((long)(in_RDI[2].data + 1) + 0) = AABox::infAAB.x1;
    *(float *)((long)(in_RDI[2].data + 1) + 4) = fVar1;
    fVar1 = AABox::infAAB.y2;
    *(float *)((long)(in_RDI[2].data + 1) + 8) = AABox::infAAB.y1;
    *(float *)((long)(in_RDI[2].data + 1) + 0xc) = fVar1;
    fVar1 = AABox::infAAB.z2;
    *(float *)((long)(in_RDI[2].data + 2) + 0) = AABox::infAAB.z1;
    *(float *)((long)(in_RDI[2].data + 2) + 4) = fVar1;
  }
  else {
    vec3f::vec3f(&local_d8,local_70.x1,local_70.y1,local_70.z1);
    vec3f::vec3f(&local_cc,local_70.x1,local_70.y1,local_70.z2);
    vec3f::vec3f(&local_c0,local_70.x1,local_70.y2,local_70.z1);
    vec3f::vec3f(&local_b4,local_70.x1,local_70.y2,local_70.z2);
    vec3f::vec3f(&local_a8,local_70.x2,local_70.y1,local_70.z1);
    vec3f::vec3f(&local_9c,local_70.x2,local_70.y1,local_70.z2);
    vec3f::vec3f(&local_90,local_70.x2,local_70.y2,local_70.z1);
    vec3f::vec3f(&local_84,local_70.x2,local_70.y2,local_70.z2);
    p = transformedPoint(in_RDI,v);
    AABox::AABox(&local_f0,p);
    *(float *)((long)(in_RDI[2].data + 1) + 0) = local_f0.x1;
    *(float *)((long)(in_RDI[2].data + 1) + 4) = local_f0.x2;
    *(float *)((long)(in_RDI[2].data + 1) + 8) = local_f0.y1;
    *(float *)((long)(in_RDI[2].data + 1) + 0xc) = local_f0.y2;
    *(float *)((long)(in_RDI[2].data + 2) + 0) = local_f0.z1;
    *(float *)((long)(in_RDI[2].data + 2) + 4) = local_f0.z2;
    for (local_124 = 1; local_124 < 8; local_124 = local_124 + 1) {
      transformedPoint(in_RDI,v);
      ::operator+(pAStack_40,local_48);
      *(undefined8 *)in_RDI[2].data[1] = local_13c;
      *(undefined8 *)(in_RDI[2].data[1] + 2) = local_134;
      *(undefined8 *)in_RDI[2].data[2] = local_12c;
    }
  }
  return;
}

Assistant:

Transformed(Primitive* inner, const mat4f& m):
		inner(inner), trans(m), invTrans(inverse(m))
	{
		// calculate bounding box of transformed shape
		// (though this bound might be looser)
		AABox t = inner->boundingVolume();
		if (t.finite()) {
			point boundpoints[] = {
				vec3f(t.x1, t.y1, t.z1),
				vec3f(t.x1, t.y1, t.z2),
				vec3f(t.x1, t.y2, t.z1),
				vec3f(t.x1, t.y2, t.z2),
				vec3f(t.x2, t.y1, t.z1),
				vec3f(t.x2, t.y1, t.z2),
				vec3f(t.x2, t.y2, t.z1),
				vec3f(t.x2, t.y2, t.z2)
			};
			bound = AABox(transformedPoint(trans, boundpoints[0]));
			for (int i=1; i<8; ++i)
				bound = bound + transformedPoint(trans, boundpoints[i]);
		}
		else {
			bound = AABox::infAAB;
		}
	}